

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkMutableDescriptorTypeListEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkMutableDescriptorTypeListEXT>
          (Impl *this,VkMutableDescriptorTypeListEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkMutableDescriptorTypeListEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkMutableDescriptorTypeListEXT>(alloc,count);
    if (pVVar1 != (VkMutableDescriptorTypeListEXT *)0x0) {
      pVVar1 = (VkMutableDescriptorTypeListEXT *)memmove(pVVar1,src,count << 4);
      return pVVar1;
    }
  }
  return (VkMutableDescriptorTypeListEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}